

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v9::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int local_54;
  
  uVar3 = lhs1->exp_;
  iVar12 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar3;
  uVar4 = lhs2->exp_;
  iVar13 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar4;
  iVar2 = iVar13;
  if (iVar13 < iVar12) {
    iVar2 = iVar12;
  }
  iVar14 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  uVar5 = rhs->exp_;
  iVar1 = uVar5 + iVar14;
  iVar7 = -1;
  if ((iVar1 <= iVar2 + 1) && (iVar7 = 1, iVar2 <= iVar1)) {
    uVar15 = uVar4;
    if ((int)uVar3 < (int)uVar4) {
      uVar15 = uVar3;
    }
    if ((int)uVar5 <= (int)uVar15) {
      uVar15 = uVar5;
    }
    uVar16 = 0;
    do {
      iVar2 = uVar5 + iVar14;
      uVar11 = uVar16;
      if (iVar2 <= (int)uVar15) break;
      if (iVar12 < iVar2 || iVar2 <= (int)uVar3) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[~uVar3 + uVar5 + iVar14];
      }
      if (iVar13 < iVar2 || iVar2 <= (int)uVar4) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[~uVar4 + uVar5 + iVar14];
      }
      if (iVar1 < iVar2 || iVar2 <= (int)uVar5) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[iVar14 - 1];
      }
      uVar11 = (uVar10 + uVar16) - (uVar9 + uVar8);
      if (uVar10 + uVar16 < uVar9 + uVar8) {
        local_54 = 1;
        bVar6 = false;
        uVar11 = uVar16;
      }
      else {
        bVar6 = uVar11 < 2;
        if (bVar6) {
          uVar11 = uVar11 << 0x20;
        }
        else {
          local_54 = -1;
        }
      }
      iVar14 = iVar14 + -1;
      uVar16 = uVar11;
    } while (bVar6);
    iVar7 = -(uint)(uVar11 != 0);
    if ((int)uVar15 < iVar2) {
      iVar7 = local_54;
    }
  }
  return iVar7;
}

Assistant:

FMT_CONSTEXPR20 int num_bigits() const {
    return static_cast<int>(bigits_.size()) + exp_;
  }